

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O2

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  entry *peVar4;
  time_point tVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  pointer pdVar10;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> str;
  
  uVar2 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  uVar9 = 0x5460;
  if (uVar2 < 0x5460) {
    uVar9 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar9 = 0;
  }
  key._M_str = "interval";
  key._M_len = 8;
  peVar4 = entry::operator[](item,key);
  entry::operator=(peVar4,(ulong)uVar9);
  sVar1 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00._M_str = "num";
  key_00._M_len = 3;
  peVar4 = entry::operator[](item,key_00);
  entry::operator=(peVar4,(long)(int)sVar1);
  tVar5 = aux::time_now();
  uVar2 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  uVar3 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4094);
  uVar9 = 0x14;
  if (uVar3 < 0x14) {
    uVar9 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar9 = 0;
  }
  uVar3 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar9 < (int)uVar3) {
    uVar3 = uVar9;
  }
  if (0 < (int)uVar2) {
    uVar7 = 0x5460;
    if (uVar2 < 0x5460) {
      uVar7 = (ulong)uVar2;
    }
    if ((long)tVar5.__d.__r <
        (long)(uVar7 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) {
      pdVar10 = (this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(this->m_infohashes_sample).samples.
                    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar10;
      if ((int)uVar9 <= (int)(lVar8 / 0x14)) goto LAB_00353051;
    }
  }
  pdVar10 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar10) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar10;
  }
  aux::
  container_wrapper<libtorrent::digest32<160l>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
  ::reserve<int,void>((container_wrapper<libtorrent::digest32<160l>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
                       *)&this->m_infohashes_sample,uVar3);
  uVar9 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var6 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var6 != &(this->m_map)._M_t._M_impl.super__Rb_tree_header &&
         (uVar3 != 0))) {
    lVar8 = aux::random((aux *)(ulong)uVar9);
    if ((uint)lVar8 <= uVar3) {
      ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
      push_back((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
                &this->m_infohashes_sample,(value_type *)(p_Var6 + 1));
      uVar3 = uVar3 - 1;
    }
    p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6);
    uVar9 = uVar9 - 1;
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar5.__d.__r;
  pdVar10 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar10;
LAB_00353051:
  key_01._M_str = "samples";
  key_01._M_len = 7;
  peVar4 = entry::operator[](item,key_01);
  str.m_len = lVar8;
  str.m_ptr = (char *)pdVar10;
  entry::operator=(peVar4,str);
  return (int)(((long)(this->m_infohashes_sample).samples.
                      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x14);
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = std::clamp(m_settings.get_int(settings_pack::dht_sample_infohashes_interval)
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}